

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O2

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::push
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this,
          MatchingStateDebugFailures *element)

{
  element_pointer_type pMVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long uVar4;
  group *__p;
  group_pointer_type pgVar5;
  char cVar6;
  ebco_pair *__args;
  
  pMVar1 = this->top_element;
  cVar6 = (pMVar1 == this->end_element) + (pMVar1 == (element_pointer_type)0x0);
  if (cVar6 == '\x02') {
    initialize(this);
    pMVar1 = this->top_element;
    pMVar1->Failures = element->Failures;
    sVar2 = (element->super_MatchingState).InPos;
    sVar3 = (element->super_MatchingState).ContainsPos;
    uVar4 = (element->super_MatchingState).LastMatched.second;
    (pMVar1->super_MatchingState).LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    (pMVar1->super_MatchingState).LastMatched.second = uVar4;
    (pMVar1->super_MatchingState).InPos = sVar2;
    (pMVar1->super_MatchingState).ContainsPos = sVar3;
  }
  else if (cVar6 == '\x01') {
    pgVar5 = this->current_group->next_group;
    if (pgVar5 == (group_pointer_type)0x0) {
      __p = (group *)operator_new(0x20);
      this->current_group->next_group = __p;
      __args = (ebco_pair *)&this->total_number_of_elements;
      if ((this->group_allocator_pair).max_block_capacity <= this->total_number_of_elements) {
        __args = &this->group_allocator_pair;
      }
      __gnu_cxx::
      new_allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>
      ::
      construct<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group,unsigned_long&,plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group*&>
                ((new_allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>
                  *)&this->group_allocator_pair,__p,&__args->max_block_capacity,&this->current_group
                );
      pgVar5 = this->current_group->next_group;
    }
    this->current_group = pgVar5;
    pMVar1 = pgVar5->elements;
    this->top_element = pMVar1;
    this->start_element = pMVar1;
    pMVar1->Failures = element->Failures;
    sVar2 = (element->super_MatchingState).InPos;
    sVar3 = (element->super_MatchingState).ContainsPos;
    uVar4 = (element->super_MatchingState).LastMatched.second;
    (pMVar1->super_MatchingState).LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    (pMVar1->super_MatchingState).LastMatched.second = uVar4;
    (pMVar1->super_MatchingState).InPos = sVar2;
    (pMVar1->super_MatchingState).ContainsPos = sVar3;
    this->end_element = this->current_group->end;
  }
  else {
    this->top_element = pMVar1 + 1;
    pMVar1[1].Failures = element->Failures;
    sVar2 = (element->super_MatchingState).InPos;
    sVar3 = (element->super_MatchingState).ContainsPos;
    uVar4 = (element->super_MatchingState).LastMatched.second;
    pMVar1[1].super_MatchingState.LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    pMVar1[1].super_MatchingState.LastMatched.second = uVar4;
    pMVar1[1].super_MatchingState.InPos = sVar2;
    pMVar1[1].super_MatchingState.ContainsPos = sVar3;
  }
  this->total_number_of_elements = this->total_number_of_elements + 1;
  return;
}

Assistant:

void push(element_type &&element)
		{
			switch ((top_element == NULL) + (top_element == end_element))
			{
				case 0:
				{
					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						catch (...)
						{
							--top_element;
							throw;
						}
					}

					++total_number_of_elements;
					return;
				}
				case 1:
				{
					if (current_group->next_group == NULL)
					{
						current_group->next_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, current_group);

						try
						{
							#ifdef PLF_VARIADICS_SUPPORT
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, (total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group);
							#else
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, group((total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group));
							#endif
						}
						catch (...)
						{
							PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, current_group->next_group, 1);
							current_group->next_group = NULL;
							throw;
						}
					}

					current_group = current_group->next_group;
					start_element = top_element = current_group->elements;

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							current_group = current_group->previous_group;
							start_element = current_group->elements;
							top_element = current_group->end;
							throw;
						}
					}


					end_element = current_group->end;
					++total_number_of_elements;
					return;
				}
				case 2: // ie. empty stack, must initialize
				{
					initialize();

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							clear();
							throw;
						}
					}


					++total_number_of_elements;
					return;
				}
			}
		}